

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O1

void Extra_TruthShrink(uint *pOut,uint *pIn,int nVars,int nVarsAll,uint Phase)

{
  uint *puVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint iVar;
  uint uVar5;
  bool bVar6;
  
  if (nVarsAll < 1) {
    bVar6 = true;
    iVar4 = 0;
  }
  else {
    uVar2 = 0;
    iVar4 = 0;
    uVar5 = 0;
    do {
      if ((Phase >> (uVar5 & 0x1f) & 1) != 0) {
        if (iVar4 < (int)uVar5) {
          puVar1 = pIn;
          iVar = uVar5;
          do {
            pIn = pOut;
            pOut = puVar1;
            iVar = iVar - 1;
            Extra_TruthSwapAdjacentVars(pIn,pOut,nVarsAll,iVar);
            puVar1 = pIn;
          } while (iVar4 < (int)iVar);
          uVar2 = (uVar2 + uVar5) - iVar4;
        }
        iVar4 = iVar4 + 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != nVarsAll);
    bVar6 = (uVar2 & 1) == 0;
  }
  if (iVar4 == nVars) {
    if (bVar6) {
      uVar2 = 1 << ((char)nVarsAll - 5U & 0x1f);
      if (nVarsAll < 6) {
        uVar2 = 1;
      }
      if (0 < (int)uVar2) {
        lVar3 = (ulong)uVar2 + 1;
        do {
          pOut[lVar3 + -2] = pIn[lVar3 + -2];
          lVar3 = lVar3 + -1;
        } while (1 < lVar3);
      }
    }
    return;
  }
  __assert_fail("Var == nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilTruth.c"
                ,0x11b,
                "void Extra_TruthShrink(unsigned int *, unsigned int *, int, int, unsigned int)");
}

Assistant:

void Extra_TruthShrink( unsigned * pOut, unsigned * pIn, int nVars, int nVarsAll, unsigned Phase )
{
    unsigned * pTemp;
    int i, k, Var = 0, Counter = 0;
    for ( i = 0; i < nVarsAll; i++ )
        if ( Phase & (1 << i) )
        {
            for ( k = i-1; k >= Var; k-- )
            {
                Extra_TruthSwapAdjacentVars( pOut, pIn, nVarsAll, k );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
                Counter++;
            }
            Var++;
        }
    assert( Var == nVars );
    // swap if it was moved an even number of times
    if ( !(Counter & 1) )
        Extra_TruthCopy( pOut, pIn, nVarsAll );
}